

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# varset.h
# Opt level: O0

VarSet * __thiscall libDAI::VarSet::operator/=(VarSet *this,Var *n)

{
  bool bVar1;
  iterator iVar2;
  iterator __position;
  reference this_00;
  size_t sVar3;
  Var *in_RSI;
  VarSet *in_RDI;
  iterator pos;
  __normal_iterator<const_libDAI::Var_*,_std::vector<libDAI::Var,_std::allocator<libDAI::Var>_>_>
  *in_stack_ffffffffffffffc0;
  __normal_iterator<libDAI::Var_*,_std::vector<libDAI::Var,_std::allocator<libDAI::Var>_>_>
  in_stack_ffffffffffffffe8;
  
  iVar2 = std::vector<libDAI::Var,_std::allocator<libDAI::Var>_>::begin(&in_RDI->_vars);
  __position = std::vector<libDAI::Var,_std::allocator<libDAI::Var>_>::end(&in_RDI->_vars);
  std::
  lower_bound<__gnu_cxx::__normal_iterator<libDAI::Var*,std::vector<libDAI::Var,std::allocator<libDAI::Var>>>,libDAI::Var>
            (in_stack_ffffffffffffffe8,
             (__normal_iterator<libDAI::Var_*,_std::vector<libDAI::Var,_std::allocator<libDAI::Var>_>_>
              )iVar2._M_current,__position._M_current);
  iVar2 = std::vector<libDAI::Var,_std::allocator<libDAI::Var>_>::end(&in_RDI->_vars);
  bVar1 = __gnu_cxx::operator!=
                    ((__normal_iterator<libDAI::Var_*,_std::vector<libDAI::Var,_std::allocator<libDAI::Var>_>_>
                      *)in_stack_ffffffffffffffc0,
                     (__normal_iterator<libDAI::Var_*,_std::vector<libDAI::Var,_std::allocator<libDAI::Var>_>_>
                      *)in_RDI);
  if (bVar1) {
    this_00 = __gnu_cxx::
              __normal_iterator<libDAI::Var_*,_std::vector<libDAI::Var,_std::allocator<libDAI::Var>_>_>
              ::operator*((__normal_iterator<libDAI::Var_*,_std::vector<libDAI::Var,_std::allocator<libDAI::Var>_>_>
                           *)&stack0xffffffffffffffe8);
    bVar1 = Var::operator==(this_00,in_RSI);
    if (bVar1) {
      __gnu_cxx::
      __normal_iterator<libDAI::Var_const*,std::vector<libDAI::Var,std::allocator<libDAI::Var>>>::
      __normal_iterator<libDAI::Var*>
                (in_stack_ffffffffffffffc0,
                 (__normal_iterator<libDAI::Var_*,_std::vector<libDAI::Var,_std::allocator<libDAI::Var>_>_>
                  *)in_RDI);
      std::vector<libDAI::Var,_std::allocator<libDAI::Var>_>::erase
                ((vector<libDAI::Var,_std::allocator<libDAI::Var>_> *)iVar2._M_current,
                 (const_iterator)__position._M_current);
      sVar3 = Var::states(in_RSI);
      in_RDI->_statespace = in_RDI->_statespace / sVar3;
    }
  }
  return in_RDI;
}

Assistant:

VarSet& operator/= ( const Var& n ) { 
                std::vector<Var>::iterator pos = lower_bound( _vars.begin(), _vars.end(), n );
                if( pos != _vars.end() )
                    if( *pos == n ) { // found variable, delete it
                        _vars.erase( pos ); 
                        _statespace /= n.states();
                    }
#ifdef DEBUG
                assert( is_sorted( _vars.begin(), _vars.end() ) );
#endif
                return *this; 
            }